

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void tmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  double *col;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  col = (double *)malloc((long)ca * (long)cb * 8);
  mtranspose(B,ca,cb,col);
  if (0 < ra) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      if (0 < cb) {
        lVar3 = uVar2 * (uint)cb;
        uVar6 = 0;
        pdVar4 = col;
        do {
          C[lVar3 + uVar6] = 0.0;
          if (0 < ca) {
            dVar7 = 0.0;
            uVar5 = 0;
            do {
              dVar7 = dVar7 + A[uVar1 + uVar5] * pdVar4[uVar5];
              C[lVar3 + uVar6] = dVar7;
              uVar5 = uVar5 + 1;
            } while ((uint)ca != uVar5);
          }
          uVar6 = uVar6 + 1;
          pdVar4 = pdVar4 + (uint)ca;
        } while (uVar6 != (uint)cb);
      }
      uVar2 = uVar2 + 1;
      uVar1 = (ulong)(uint)((int)uVar1 + ca);
    } while (uVar2 != (uint)ra);
  }
  free(col);
  return;
}

Assistant:

void tmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	double *BT;
	BT = (double*) malloc(sizeof(double) * ca * cb);
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	mtranspose(B,ca,cb,BT);
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * BT[k + j * rb];
			}
		}
	}
	
	free(BT);

}